

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

void QFontDatabase::setApplicationFallbackFontFamilies(Script script,QStringList *familyNames)

{
  long lVar1;
  bool bVar2;
  QFontDatabasePrivate *in_RSI;
  ExtendedScript in_EDI;
  long in_FS_OFFSET;
  QFontDatabasePrivate *db;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QFontDatabasePrivate *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  QDebug local_30;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff90,
             (QRecursiveMutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (((int)in_EDI < 2) || (0xaa < (int)in_EDI)) {
    t = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcFontDb();
    anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff90,
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffd8), bVar2) {
      anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x747979);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RSI,
                 (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (char *)0x74798f);
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)CONCAT44(in_EDI,in_stack_ffffffffffffffa8),t);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      QDebug::~QDebug(&local_30);
    }
  }
  else {
    if (in_EDI == Script_Latin) {
      in_EDI = Script_Common;
    }
    in_stack_ffffffffffffff90 = QFontDatabasePrivate::instance();
    QFontDatabasePrivate::setApplicationFallbackFontFamilies
              (in_RSI,in_EDI,
               (QStringList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDatabase::setApplicationFallbackFontFamilies(QChar::Script script, const QStringList &familyNames)
{
    QMutexLocker locker(fontDatabaseMutex());

    if (script < QChar::Script_Common || script >= QChar::ScriptCount) {
        qCWarning(lcFontDb) << "Invalid script passed to setApplicationFallbackFontFamilies:" << script;
        return;
    }

    if (script == QChar::Script_Latin)
        script = QChar::Script_Common;

    auto *db = QFontDatabasePrivate::instance();
    db->setApplicationFallbackFontFamilies(QFontDatabasePrivate::ExtendedScript(script),
                                           familyNames);
}